

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

void Prs_CreateSignalOut(Cba_Ntk_t *p,int iFon,Prs_Ntk_t *pNtk,int Sig)

{
  Cba_Man_t *pCVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  int iData2;
  int *piVar13;
  int Fill;
  int Fill_00;
  int Fill_01;
  Prs_Ntk_t *pNtk_00;
  Prs_Ntk_t *pNtk_01;
  long lVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  
  if (Sig < 0) {
LAB_003e8d81:
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x13e,"int Abc_Lit2Att2(int)");
  }
  if (Sig == 0) {
    return;
  }
  uVar11 = (ulong)(uint)iFon;
  uVar16 = Sig & 3;
  uVar15 = (uint)Sig >> 2;
  if (uVar16 == 0) {
    pcVar10 = Abc_NamStr(p->pDesign->pStrs,uVar15);
    iVar17 = strncmp(pcVar10,"Open_",5);
    if (iVar17 == 0) {
      return;
    }
    Cba_FonSetName(p,iFon,uVar15);
    Prs_CreateRange(p,iFon,uVar15);
    return;
  }
  uVar6 = Cba_NtkNewStrId(p,"_occ%d_",uVar11);
  Cba_FonSetName(p,iFon,uVar6);
  pCVar1 = p->pDesign;
  Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill);
  if (((int)uVar6 < 0) || ((pCVar1->vNameMap).nSize <= (int)uVar6)) goto LAB_003e8d43;
  if ((pCVar1->vNameMap).pArray[uVar6] != 0) {
    __assert_fail("Vec_IntGetEntry(&p->vNameMap, i) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                  ,0x30e,"void Cba_ManSetMap(Cba_Man_t *, int, int)");
  }
  Vec_IntFillExtra(&pCVar1->vNameMap,uVar6 + 1,Fill_00);
  if ((int)uVar6 < (pCVar1->vNameMap).nSize) {
    (pCVar1->vNameMap).pArray[uVar6] = iFon;
    Vec_IntPush(&pCVar1->vUsed,uVar6);
    if (uVar16 == 3) {
      iVar17 = (pNtk->vConcats).nSize;
      if (iVar17 <= (int)uVar15) goto LAB_003e8d43;
      piVar13 = (pNtk->vConcats).pArray;
      uVar16 = piVar13[uVar15];
      Prs_CatSignals_V_1 = uVar16;
      if (iVar17 <= (int)(uVar15 + 1)) goto LAB_003e8d62;
      piVar13 = piVar13 + (uVar15 + 1);
      Prs_CatSignals_V_2 = piVar13;
      if (1 < (int)uVar16) {
        iVar17 = -1;
        lVar14 = 0;
        do {
          iVar8 = piVar13[lVar14];
          piVar13[lVar14] = piVar13[(int)(uVar16 + iVar17)];
          piVar13[(int)(uVar16 + iVar17)] = iVar8;
          lVar14 = lVar14 + 1;
          iVar17 = iVar17 + -1;
        } while (lVar14 < (int)uVar16 / 2);
      }
      piVar13 = (int *)(ulong)uVar16;
      uVar12 = (ulong)Prs_CatSignals_V_1;
      if ((int)Prs_CatSignals_V_1 < 1) {
        iVar17 = 0;
      }
      else {
        pVVar3 = &p->vArray0;
        lVar14 = 0;
        iVar17 = 0;
        do {
          uVar15 = Prs_CatSignals_V_2[lVar14];
          if ((int)uVar15 < 0) goto LAB_003e8d81;
          uVar16 = uVar15 >> 2;
          if ((uVar15 & 3) == 1) {
            iVar8 = (pNtk->vSlices).nSize;
            if ((iVar8 <= (int)uVar16) || (iVar8 <= (int)(uVar16 + 1))) goto LAB_003e8d43;
            piVar13 = (pNtk->vSlices).pArray;
            iVar8 = piVar13[uVar16];
            iVar7 = piVar13[uVar16 + 1];
            iData2 = 0;
            iVar9 = 0;
            if (iVar7 != 0) {
              if (iVar7 < 0) goto LAB_003e8d62;
              pVVar4 = p->pDesign->vHash->vObjs;
              uVar15 = iVar7 * 4;
              uVar16 = pVVar4->nSize;
              if (uVar16 == uVar15 || SBORROW4(uVar16,uVar15) != (int)(uVar16 + iVar7 * -4) < 0)
              goto LAB_003e8d62;
              iVar9 = pVVar4->pArray[uVar15];
            }
            if (iVar7 != 0) {
              if (iVar7 < 0) goto LAB_003e8d62;
              pVVar4 = p->pDesign->vHash->vObjs;
              uVar15 = iVar7 * 4;
              uVar16 = pVVar4->nSize;
              if (uVar16 == uVar15 || SBORROW4(uVar16,uVar15) != (int)(uVar16 + iVar7 * -4) < 0)
              goto LAB_003e8d62;
              iData2 = pVVar4->pArray[(ulong)uVar15 + 1];
            }
            iVar9 = iVar9 - iData2;
            iVar5 = -iVar9;
            if (0 < iVar9) {
              iVar5 = iVar9;
            }
            uVar11 = (ulong)(iVar5 + 1);
            uVar15 = Hash_Int2ManInsert(p->pDesign->vHash,iVar5 + iVar17,iVar17,iData2);
            piVar13 = (int *)(ulong)uVar15;
            iVar9 = Prs_CreateSlice(p,iFon,pNtk_01,uVar15);
            Vec_IntPush(pVVar3,iVar8);
            Vec_IntPush(pVVar3,iVar7);
            Vec_IntPush(pVVar3,iVar9);
LAB_003e8c61:
            iVar17 = iVar17 + (int)uVar11;
          }
          else {
            if ((uVar15 & 3) != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                            ,0x622,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
            }
            pcVar10 = Abc_NamStr(p->pDesign->pStrs,uVar16);
            iVar8 = strncmp(pcVar10,"Open_",5);
            if (iVar8 == 0) {
              iVar17 = iVar17 + 1;
            }
            else {
              uVar15 = Cba_ObjAlloc(p,CBA_BOX_BUF,1,1);
              if ((int)uVar15 < 1) {
                __assert_fail("i>0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                              ,0xe8,"int Cba_ObjFon0(Cba_Ntk_t *, int)");
              }
              if ((p->vObjFon0).nSize <= (int)uVar15) goto LAB_003e8d43;
              iVar7 = (p->vObjFon0).pArray[uVar15];
              uVar6 = uVar15;
              Cba_FonSetName(p,iVar7,uVar16);
              uVar16 = Prs_CreateRange(p,iVar7,uVar16);
              uVar11 = (ulong)uVar16;
              iVar7 = Hash_Int2ManInsert(p->pDesign->vHash,iVar17 + uVar16 + -1,iVar17,uVar6);
              uVar16 = Prs_CreateSlice(p,iFon,pNtk_00,iVar7);
              piVar13 = (int *)(ulong)uVar16;
              Cba_ObjSetFinFon(p,uVar15,0,uVar16);
            }
            if (iVar8 != 0) goto LAB_003e8c61;
          }
          lVar14 = lVar14 + 1;
          uVar12 = (ulong)(int)Prs_CatSignals_V_1;
        } while (lVar14 < (long)uVar12);
      }
      piVar2 = Prs_CatSignals_V_2;
      uVar15 = Prs_CatSignals_V_1;
      if (1 < (int)uVar12) {
        iVar8 = (int)Prs_CatSignals_V_1 / 2;
        iVar7 = -1;
        lVar14 = 0;
        do {
          iVar9 = piVar2[lVar14];
          piVar2[lVar14] = piVar2[(int)uVar12 + iVar7];
          piVar2[(int)(uVar15 + iVar7)] = iVar9;
          lVar14 = lVar14 + 1;
          iVar7 = iVar7 + -1;
          uVar12 = (ulong)uVar15;
          piVar13 = piVar2;
        } while (lVar14 < iVar8);
      }
    }
    else {
      if (uVar16 != 1) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaReadVer.c"
                      ,0x628,"void Prs_CreateSignalOut(Cba_Ntk_t *, int, Prs_Ntk_t *, int)");
      }
      iVar17 = (pNtk->vSlices).nSize;
      if ((iVar17 <= (int)uVar15) || (iVar17 <= (int)(uVar15 + 1))) {
LAB_003e8d43:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar2 = (pNtk->vSlices).pArray;
      iVar8 = piVar2[uVar15 + 1];
      piVar13 = (int *)0x0;
      iVar7 = 0;
      if (iVar8 != 0) {
        if (iVar8 < 0) goto LAB_003e8d62;
        pVVar3 = p->pDesign->vHash->vObjs;
        uVar16 = iVar8 * 4;
        uVar6 = pVVar3->nSize;
        if (uVar6 == uVar16 || SBORROW4(uVar6,uVar16) != (int)(uVar6 + iVar8 * -4) < 0)
        goto LAB_003e8d62;
        iVar7 = pVVar3->pArray[uVar16];
      }
      if (iVar8 != 0) {
        if (iVar8 < 0) {
LAB_003e8d62:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        pVVar3 = p->pDesign->vHash->vObjs;
        uVar16 = iVar8 * 4;
        uVar6 = pVVar3->nSize;
        if (uVar6 == uVar16 || SBORROW4(uVar6,uVar16) != (int)(uVar6 + iVar8 * -4) < 0)
        goto LAB_003e8d62;
        piVar13 = (int *)(ulong)(uint)pVVar3->pArray[(ulong)uVar16 + 1];
      }
      iVar7 = iVar7 - (int)piVar13;
      iVar17 = -iVar7;
      if (0 < iVar7) {
        iVar17 = iVar7;
      }
      iVar17 = iVar17 + 1;
      pVVar3 = &p->vArray0;
      Vec_IntPush(pVVar3,piVar2[uVar15]);
      Vec_IntPush(pVVar3,iVar8);
      Vec_IntPush(pVVar3,iFon);
    }
    iVar17 = Hash_Int2ManInsert(p->pDesign->vHash,iVar17 + -1,0,(int)piVar13);
    if ((p->vFonRange).nSize < 1) {
      __assert_fail("Cba_NtkHasFonRanges(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cba.h"
                    ,0x119,"void Cba_FonSetRange(Cba_Ntk_t *, int, int)");
    }
    if (iVar17 < 0) {
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_IntFillExtra(&p->vFonRange,iFon + 1,Fill_01);
    if ((-1 < iFon) && (iFon < (p->vFonRange).nSize)) {
      (p->vFonRange).pArray[(uint)iFon] = iVar17 * 2;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Prs_CreateSignalOut( Cba_Ntk_t * p, int iFon, Prs_Ntk_t * pNtk, int Sig )
{
    int i, iFonNew, NameOut, RangeOut, NameId, RangeId, RangeSize, nBits = 0; 
    Prs_ManType_t SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
    int SigValue = Abc_Lit2Var2( Sig );
    if ( !Sig ) return;
    if ( SigType == CBA_PRS_NAME )
    {
        NameId = SigValue;
        if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
            return;
        Cba_FonSetName( p, iFon, NameId );
        Prs_CreateRange( p, iFon, NameId );
        return;
    }
    // create name for this fan
    NameOut = Cba_NtkNewStrId( p, "_occ%d_", iFon );
    Cba_FonSetName( p, iFon, NameOut );
    Cba_NtkSetMap( p, NameOut, iFon );
    // consider special cases
    if ( SigType == CBA_PRS_SLICE )
    {
        NameId  = Prs_SliceName(pNtk, SigValue);
        RangeId = Prs_SliceRange(pNtk, SigValue);
        nBits   = Cba_NtkRangeSize(p, RangeId);
        // save this slice
        Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFon );
    }
    else if ( SigType == CBA_PRS_CONCAT )
    {
        Vec_Int_t * vSigs = Prs_CatSignals(pNtk, SigValue);
        Vec_IntReverseOrder( vSigs );
        Vec_IntForEachEntry( vSigs, Sig, i )
        {
            SigType = (Prs_ManType_t)Abc_Lit2Att2( Sig );
            SigValue = Abc_Lit2Var2( Sig );
            if ( SigType == CBA_PRS_NAME )
            {
                int iObjBuf, iFonBuf;
                // create buffer
                NameId = SigValue;
                if ( !strncmp(Cba_NtkStr(p, NameId), "Open_", 5) )
                {
                    nBits++;
                    continue;
                }
                iObjBuf   = Cba_ObjAlloc( p, CBA_BOX_BUF, 1, 1 );
                iFonBuf   = Cba_ObjFon0(p, iObjBuf);
                Cba_FonSetName( p, iFonBuf, NameId );
                RangeSize = Prs_CreateRange( p, iFonBuf, NameId );
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                Cba_ObjSetFinFon( p, iObjBuf, 0, iFonNew );
            }
            else if ( SigType == CBA_PRS_SLICE )
            {
                NameId    = Prs_SliceName(pNtk, SigValue);
                RangeId   = Prs_SliceRange(pNtk, SigValue);
                RangeSize = Cba_NtkRangeSize(p, RangeId);
                RangeOut  = Cba_NtkHashRange(p, nBits+RangeSize-1, nBits);
                // create slice
                iFonNew   = Prs_CreateSlice( p, iFon, pNtk, RangeOut );
                // save this slice
                Vec_IntPushThree( &p->vArray0, NameId, RangeId, iFonNew );
            }
            else assert( 0 );
            // increment complete range
            nBits += RangeSize;
        }
        Vec_IntReverseOrder( vSigs );
    }
    else assert( 0 );
    // set the range for the output
    Cba_FonHashRange( p, iFon, nBits-1, 0 );
}